

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

void __thiscall p2t::Triangle::Clear(Triangle *this)

{
  int local_1c;
  int i;
  Triangle *t;
  Triangle *this_local;
  
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    if (this->neighbors_[local_1c] != (Triangle *)0x0) {
      ClearNeighbor(this->neighbors_[local_1c],this);
    }
  }
  ClearNeighbors(this);
  this->points_[2] = (Point *)0x0;
  this->points_[1] = (Point *)0x0;
  this->points_[0] = (Point *)0x0;
  return;
}

Assistant:

void Triangle::Clear()
{
    Triangle *t;
    for( int i=0; i<3; i++ )
    {
        t = neighbors_[i];
        if( t != NULL )
        {
            t->ClearNeighbor( this );
        }
    }
    ClearNeighbors();
    points_[0]=points_[1]=points_[2] = NULL;
}